

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int setDateTimeToCurrent(sqlite3_context *context,DateTime *p)

{
  int iVar1;
  long lVar2;
  i64 *pTimeOut;
  
  lVar2 = context->pVdbe->iCurrentTime;
  if (lVar2 == 0) {
    pTimeOut = &context->pVdbe->iCurrentTime;
    iVar1 = sqlite3OsCurrentTimeInt64(context->pOut->db->pVfs,pTimeOut);
    if (iVar1 != 0) {
      *pTimeOut = 0;
      p->iJD = 0;
      return 1;
    }
    lVar2 = *pTimeOut;
  }
  p->iJD = lVar2;
  if (lVar2 < 1) {
    return 1;
  }
  p->validJD = '\x01';
  return 0;
}

Assistant:

static int setDateTimeToCurrent(sqlite3_context *context, DateTime *p){
  p->iJD = sqlite3StmtCurrentTime(context);
  if( p->iJD>0 ){
    p->validJD = 1;
    return 0;
  }else{
    return 1;
  }
}